

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

void Abc_NtkLogicMakeDirectSops(Abc_Ntk_t *pNtk)

{
  Mem_Flex_t *pMan;
  bool bVar1;
  int iVar2;
  uint numVars;
  Abc_Obj_t *pAVar3;
  DdManager *dd_00;
  Vec_Str_t *vCube_00;
  DdNode *n;
  char *pcVar4;
  int local_3c;
  int i;
  int fFound;
  int nFaninsMax;
  Abc_Obj_t *pNode;
  Vec_Str_t *vCube;
  DdNode *bFunc;
  DdManager *dd;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkHasSop(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x223,"void Abc_NtkLogicMakeDirectSops(Abc_Ntk_t *)");
  }
  bVar1 = false;
  local_3c = 0;
  do {
    iVar2 = Vec_PtrSize(pNtk->vObjs);
    if (iVar2 <= local_3c) {
LAB_00ad1e9d:
      if (bVar1) {
        numVars = Abc_NtkGetFaninMax(pNtk);
        if (numVars == 0) {
          printf("Warning: The network has only constant nodes.\n");
        }
        dd_00 = Cudd_Init(numVars,0,0x100,0x40000,0);
        vCube_00 = Vec_StrAlloc(100);
        for (local_3c = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_3c < iVar2;
            local_3c = local_3c + 1) {
          pAVar3 = Abc_NtkObj(pNtk,local_3c);
          if (((pAVar3 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar3), iVar2 != 0)) &&
             ((iVar2 = Abc_ObjIsBarBuf(pAVar3), iVar2 == 0 &&
              (iVar2 = Abc_SopIsComplement((char *)(pAVar3->field_5).pData), iVar2 != 0)))) {
            n = Abc_ConvertSopToBdd(dd_00,(char *)(pAVar3->field_5).pData,(DdNode **)0x0);
            Cudd_Ref(n);
            pMan = (Mem_Flex_t *)pNtk->pManFunc;
            iVar2 = Abc_ObjFaninNum(pAVar3);
            pcVar4 = Abc_ConvertBddToSop(pMan,dd_00,n,n,iVar2,0,vCube_00,1);
            (pAVar3->field_5).pData = pcVar4;
            Cudd_RecursiveDeref(dd_00,n);
            iVar2 = Abc_SopIsComplement((char *)(pAVar3->field_5).pData);
            if (iVar2 != 0) {
              __assert_fail("!Abc_SopIsComplement((char *)pNode->pData)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                            ,0x23e,"void Abc_NtkLogicMakeDirectSops(Abc_Ntk_t *)");
            }
          }
        }
        Vec_StrFree(vCube_00);
        Extra_StopManager(dd_00);
      }
      return;
    }
    pAVar3 = Abc_NtkObj(pNtk,local_3c);
    if ((((pAVar3 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar3), iVar2 != 0)) &&
        (iVar2 = Abc_ObjIsBarBuf(pAVar3), iVar2 == 0)) &&
       (iVar2 = Abc_SopIsComplement((char *)(pAVar3->field_5).pData), iVar2 != 0)) {
      bVar1 = true;
      goto LAB_00ad1e9d;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void Abc_NtkLogicMakeDirectSops( Abc_Ntk_t * pNtk )
{
    DdManager * dd;
    DdNode * bFunc;
    Vec_Str_t * vCube;
    Abc_Obj_t * pNode;
    int nFaninsMax, fFound, i;

    assert( Abc_NtkHasSop(pNtk) );

    // check if there are nodes with complemented SOPs
    fFound = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Abc_ObjIsBarBuf(pNode) && Abc_SopIsComplement((char *)pNode->pData) )
        {
            fFound = 1;
            break;
        }
    if ( !fFound )
        return;

    // start the BDD package
    nFaninsMax = Abc_NtkGetFaninMax( pNtk );
    if ( nFaninsMax == 0 )
        printf( "Warning: The network has only constant nodes.\n" );
    dd = Cudd_Init( nFaninsMax, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );

    // change the cover of negated nodes
    vCube = Vec_StrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Abc_ObjIsBarBuf(pNode) && Abc_SopIsComplement((char *)pNode->pData) )
        {
            bFunc = Abc_ConvertSopToBdd( dd, (char *)pNode->pData, NULL );  Cudd_Ref( bFunc );
            pNode->pData = Abc_ConvertBddToSop( (Mem_Flex_t *)pNtk->pManFunc, dd, bFunc, bFunc, Abc_ObjFaninNum(pNode), 0, vCube, 1 );
            Cudd_RecursiveDeref( dd, bFunc );
            assert( !Abc_SopIsComplement((char *)pNode->pData) );
        }
    Vec_StrFree( vCube );
    Extra_StopManager( dd );
}